

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O0

int oonf_packet_send_managed
              (oonf_packet_managed *managed,netaddr_socket *remote,void *data,size_t length)

{
  oonf_log_source oVar1;
  int *piVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 local_b2 [8];
  netaddr_str buf;
  int result;
  size_t length_local;
  void *data_local;
  netaddr_socket *remote_local;
  oonf_packet_managed *managed_local;
  
  if ((remote->v4).sin_family == 0) {
    managed_local._4_4_ = 0;
  }
  else {
    buf.buf[0x36] = '\x01';
    buf.buf[0x37] = '\0';
    buf.buf[0x38] = '\0';
    buf.buf[0x39] = '\0';
    unique0x10000230 = length;
    piVar2 = __errno_location();
    *piVar2 = 0;
    bVar4 = false;
    if ((managed->socket_v4).scheduler_entry._node.next != (list_entity *)0x0) {
      bVar4 = (managed->socket_v4).scheduler_entry._node.prev != (list_entity *)0x0;
    }
    if ((bVar4) && ((remote->v4).sin_family == 2)) {
      buf.buf._54_4_ = oonf_packet_send(&managed->socket_v4,remote,data,stack0xffffffffffffff90);
    }
    oVar1 = _oonf_packet_socket_subsystem.logging;
    bVar4 = false;
    if ((managed->socket_v6).scheduler_entry._node.next != (list_entity *)0x0) {
      bVar4 = (managed->socket_v6).scheduler_entry._node.prev != (list_entity *)0x0;
    }
    if ((bVar4) && ((remote->v4).sin_family == 10)) {
      buf.buf._54_4_ = oonf_packet_send(&managed->socket_v6,remote,data,stack0xffffffffffffff90);
    }
    else if (((&log_global_mask)[_oonf_packet_socket_subsystem.logging] & 1) != 0) {
      uVar3 = netaddr_socket_to_string(local_b2,remote);
      oonf_log(1,oVar1,"src/base/oonf_packet_socket.c",0x16c,0,0,
               "Managed socket did not sent packet to %s because socket was not active",uVar3);
    }
    piVar2 = __errno_location();
    if (*piVar2 == 9) {
      if ((remote->v4).sin_family == 2) {
        oonf_packet_remove(&managed->socket_v4,true);
      }
      else {
        oonf_packet_remove(&managed->socket_v6,true);
      }
      _apply_managed(managed);
    }
    managed_local._4_1_ = buf.buf[0x36];
    managed_local._5_1_ = buf.buf[0x37];
    managed_local._6_1_ = buf.buf[0x38];
    managed_local._7_1_ = buf.buf[0x39];
  }
  return managed_local._4_4_;
}

Assistant:

int
oonf_packet_send_managed(
  struct oonf_packet_managed *managed, union netaddr_socket *remote, const void *data, size_t length) {
  int result;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  if (netaddr_socket_get_addressfamily(remote) == AF_UNSPEC) {
    return 0;
  }

  result = 1;
  errno = 0;
  if (list_is_node_added(&managed->socket_v4.scheduler_entry._node) &&
      netaddr_socket_get_addressfamily(remote) == AF_INET) {
    result = oonf_packet_send(&managed->socket_v4, remote, data, length);
  }
  if (list_is_node_added(&managed->socket_v6.scheduler_entry._node) &&
      netaddr_socket_get_addressfamily(remote) == AF_INET6) {
    result = oonf_packet_send(&managed->socket_v6, remote, data, length);
  }
  else {
    OONF_DEBUG(LOG_PACKET, "Managed socket did not sent packet to %s because socket was not active",
      netaddr_socket_to_string(&buf, remote));
  }

  if (errno == EBADF) {
    /* file descriptor is not working anymore */
    if (netaddr_socket_get_addressfamily(remote) == AF_INET) {
      oonf_packet_remove(&managed->socket_v4, true);
    }
    else {
      oonf_packet_remove(&managed->socket_v6, true);
    }

    /* try to re-open */
    _apply_managed(managed);
  }
  return result;
}